

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void logic_or(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  char *pcVar3;
  size_t sVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  TokenType TVar7;
  undefined4 uVar8;
  Token local_50;
  
  logic_and(vm);
  if ((vm->compiler).token.type == TOKEN_OR) {
    pCVar1 = &vm->compiler;
    pTVar2 = &(vm->compiler).next;
    do {
      TVar7 = (pCVar1->token).type;
      uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar3 = (vm->compiler).token.start;
      uVar5 = (vm->compiler).token.line;
      uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar5;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar6;
      (vm->compiler).previous.type = TVar7;
      *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
      (vm->compiler).previous.start = pcVar3;
      uVar6 = *(undefined4 *)&pTVar2->field_0x4;
      pcVar3 = (vm->compiler).next.start;
      sVar4 = (vm->compiler).next.length;
      uVar5 = (vm->compiler).next.line;
      uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = pTVar2->type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
      (vm->compiler).token.start = pcVar3;
      (vm->compiler).token.length = sVar4;
      (vm->compiler).token.line = uVar5;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
      scan_token(&local_50,&(vm->compiler).scanner);
      (vm->compiler).next.length = local_50.length;
      (vm->compiler).next.line = local_50.line;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
      pTVar2->type = local_50.type;
      *(undefined4 *)&pTVar2->field_0x4 = local_50._4_4_;
      (vm->compiler).next.start = local_50.start;
      logic_and(vm);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\v');
    } while ((vm->compiler).token.type == TOKEN_OR);
  }
  return;
}

Assistant:

static void logic_or(Vm *vm) {
    logic_and(vm);

    while (match(vm, TOKEN_OR)) {
        logic_and(vm);
        emit_no_arg(vm, OP_OR);
    }
}